

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

UChar * u_memchr32_63(UChar *s,UChar32 c,int32_t count)

{
  UChar trail;
  UChar lead;
  UChar *limit;
  int32_t count_local;
  UChar32 c_local;
  UChar *s_local;
  
  if ((uint)c < 0x10000) {
    s_local = u_memchr_63(s,(UChar)c,count);
  }
  else if (count < 2) {
    s_local = (UChar *)0x0;
  }
  else if ((uint)c < 0x110000) {
    _count_local = s;
    do {
      if ((*_count_local == (UChar)((short)(c >> 10) + L'ퟀ')) &&
         (_count_local[1] == ((UChar)c & 0x3ffU | 0xdc00U))) {
        return _count_local;
      }
      _count_local = _count_local + 1;
    } while (_count_local != s + (long)count + -1);
    s_local = (UChar *)0x0;
  }
  else {
    s_local = (UChar *)0x0;
  }
  return s_local;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_memchr32(const UChar *s, UChar32 c, int32_t count) {
    if((uint32_t)c<=U_BMP_MAX) {
        /* find BMP code point */
        return u_memchr(s, (UChar)c, count);
    } else if(count<2) {
        /* too short for a surrogate pair */
        return NULL;
    } else if((uint32_t)c<=UCHAR_MAX_VALUE) {
        /* find supplementary code point as surrogate pair */
        const UChar *limit=s+count-1; /* -1 so that we do not need a separate check for the trail unit */
        UChar lead=U16_LEAD(c), trail=U16_TRAIL(c);

        do {
            if(*s==lead && *(s+1)==trail) {
                return (UChar *)s;
            }
        } while(++s!=limit);
        return NULL;
    } else {
        /* not a Unicode code point, not findable */
        return NULL;
    }
}